

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteredStorage.hpp
# Opt level: O3

optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_> * __thiscall
supermap::
FilteredStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_supermap::Key<2UL>,_supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
::find(optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_> *__return_storage_ptr__,
      FilteredStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_supermap::Key<2UL>,_supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
      *this,Key<2UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
            *equal)

{
  _Manager_type p_Var1;
  char cVar2;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  undefined1 local_48 [8];
  long *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  (*(this->
    super_SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
    ).
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
    .
    super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
    ._vptr_Cloneable[4])
            (local_48,&(this->
                       super_SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
                       ).
                       super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
                       .
                       super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
                       .
                       super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
                       .register_);
  cVar2 = (**(code **)(*local_40 + 0x20))(local_40,pattern);
  if (cVar2 == '\0') {
    (__return_storage_ptr__->
    super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_true,_true>).
    _M_payload.super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>.
    _M_engaged = false;
  }
  else {
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_58 = (_Manager_type)0x0;
    local_50 = less->_M_invoker;
    p_Var1 = (less->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_68._M_unused._0_8_ = (undefined8)*(undefined8 *)&(less->super__Function_base)._M_functor
      ;
      local_68._8_8_ = *(undefined8 *)((long)&(less->super__Function_base)._M_functor + 8);
      (less->super__Function_base)._M_manager = (_Manager_type)0x0;
      less->_M_invoker = (_Invoker_type)0x0;
      local_58 = p_Var1;
    }
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_78 = (_Manager_type)0x0;
    local_70 = equal->_M_invoker;
    p_Var1 = (equal->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_88._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(equal->super__Function_base)._M_functor;
      local_88._8_8_ = *(undefined8 *)((long)&(equal->super__Function_base)._M_functor + 8);
      (equal->super__Function_base)._M_manager = (_Manager_type)0x0;
      equal->_M_invoker = (_Invoker_type)0x0;
      local_78 = p_Var1;
    }
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
    ::find(__return_storage_ptr__,
           &this->
            super_SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
           ,pattern,(function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
                     *)&local_68,
           (function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
            *)&local_88);
    if (local_78 != (_Manager_type)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    if (local_58 != (_Manager_type)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Content> find(
        const FindPattern &pattern,
        std::function<bool(const Content &, const FindPattern &)> less,
        std::function<bool(const Content &, const FindPattern &)> equal
    ) override {
        std::shared_ptr<FilterBase> filter = this->getRegisterInfo().additional;
        if (!filter->mightContain(pattern)) {
            return std::nullopt;
        }
        return SortedStorage::find(pattern, std::move(less), std::move(equal));
    }